

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer pvVar1;
  Graph *this;
  ostream *poVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *x;
  pointer pvVar3;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vec;
  
  this = (Graph *)operator_new(0x20);
  Graph::Graph(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"0",(allocator<char> *)&vec);
  Graph::add_node(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"1",(allocator<char> *)&vec);
  Graph::add_node(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"2",(allocator<char> *)&vec);
  Graph::add_node(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"3",(allocator<char> *)&vec);
  Graph::add_node(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"4",(allocator<char> *)&vec);
  Graph::add_node(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"0",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vec,"1",&local_69);
  Graph::add_edge(this,&local_68,(string *)&vec,-1.0);
  std::__cxx11::string::~string((string *)&vec);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"0",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vec,"2",&local_69);
  Graph::add_edge(this,&local_68,(string *)&vec,4.0);
  std::__cxx11::string::~string((string *)&vec);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"1",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vec,"2",&local_69);
  Graph::add_edge(this,&local_68,(string *)&vec,3.0);
  std::__cxx11::string::~string((string *)&vec);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"1",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vec,"3",&local_69);
  Graph::add_edge(this,&local_68,(string *)&vec,2.0);
  std::__cxx11::string::~string((string *)&vec);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"1",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vec,"4",&local_69);
  Graph::add_edge(this,&local_68,(string *)&vec,2.0);
  std::__cxx11::string::~string((string *)&vec);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"3",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vec,"2",&local_69);
  Graph::add_edge(this,&local_68,(string *)&vec,5.0);
  std::__cxx11::string::~string((string *)&vec);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"3",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vec,"1",&local_69);
  Graph::add_edge(this,&local_68,(string *)&vec,1.0);
  std::__cxx11::string::~string((string *)&vec);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"4",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vec,"3",&local_69);
  Graph::add_edge(this,&local_68,(string *)&vec,-3.0);
  std::__cxx11::string::~string((string *)&vec);
  std::__cxx11::string::~string((string *)&local_68);
  vec.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vec.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vec.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"0",&local_6a);
  Graph::bellman_ford(this,&local_68,&vec);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pvVar1 = vec.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar3 = vec.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1; pvVar3 = pvVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             (string *)
                             (pvVar3->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    ((pvVar3->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  Graph::print(this);
  Graph::~Graph(this);
  operator_delete(this,0x20);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&vec);
  return 0;
}

Assistant:

int main() {

    auto graph = new Graph();
    graph->add_node("0");
    graph->add_node("1");
    graph->add_node("2");
    graph->add_node("3");
    graph->add_node("4");

    graph->add_edge("0", "1", -1);
    graph->add_edge("0", "2", 4);
    graph->add_edge("1", "2", 3);
    graph->add_edge("1", "3", 2);
    graph->add_edge("1", "4", 2);
    graph->add_edge("3", "2", 5);
    graph->add_edge("3", "1", 1);
    graph->add_edge("4", "3", -3);

    std::vector<std::vector<std::string>> vec;
    cout << graph->bellman_ford("0",vec) << endl;
    
    for (auto const &x : vec) {
       cout << x[0] << " - " << x[1] << endl;
    }

    graph->print();

    delete graph;

    return 0;
}